

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O0

void __thiscall QAccessibleMenuItem::actionNames(QAccessibleMenuItem *this)

{
  QAccessibleMenuItem *in_stack_00000008;
  
  actionNames(in_stack_00000008);
  return;
}

Assistant:

QStringList QAccessibleMenuItem::actionNames() const
{
    QStringList actions;
    if (!m_action || m_action->isSeparator())
        return actions;

    if (m_action->menu()) {
        actions << showMenuAction();
    } else {
        actions << pressAction();
    }
    return actions;
}